

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O3

void idx2::Dealloc(sub_channel *Sc)

{
  allocator *paVar1;
  
  paVar1 = (Sc->BlockExpStream).Stream.Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,Sc);
  paVar1 = (Sc->BrickExpStream).Stream.Alloc;
  (Sc->BlockExpStream).BitPtr = (Sc->BlockExpStream).Stream.Data;
  (Sc->BlockExpStream).BitPos = 0;
  (Sc->BlockExpStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&Sc->BrickExpStream);
  (Sc->BrickExpStream).BitPtr = (Sc->BrickExpStream).Stream.Data;
  (Sc->BrickExpStream).BitPos = 0;
  (Sc->BrickExpStream).BitBuf = 0;
  return;
}

Assistant:

void
Dealloc(sub_channel* Sc)
{
  Dealloc(&Sc->BlockExpStream);
  Dealloc(&Sc->BrickExpStream);
}